

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dmp_test.cpp
# Opt level: O2

void __thiscall
diff_match_patch_test::assertTrue(diff_match_patch_test *this,wstring *strCase,bool value)

{
  pointer pwVar1;
  wstring *this_00;
  undefined7 in_register_00000011;
  
  ResetOutputStream();
  pwVar1 = (strCase->_M_dataplus)._M_p;
  if ((int)CONCAT71(in_register_00000011,value) != 0) {
    wprintf(L"%ls OK",pwVar1);
    wprintf(L"\n");
    return;
  }
  wprintf(L"%ls FAIL\nExpected: true\nActual: false",pwVar1);
  wprintf(L"\n");
  this_00 = (wstring *)__cxa_allocate_exception(0x20);
  std::__cxx11::wstring::wstring(this_00,(wstring *)strCase);
  __cxa_throw(this_00,&std::__cxx11::wstring::typeinfo,std::__cxx11::wstring::~wstring);
}

Assistant:

void diff_match_patch_test::assertTrue(const std::wstring &strCase, bool value) {
  if (!value) {
    dmpDebug(L"%ls FAIL\nExpected: true\nActual: false", dmpPrintable(strCase));
    throw strCase;
  }
  dmpDebug(L"%ls OK", dmpPrintable(strCase));
}